

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O1

saucy_graph *
buildSim2Graph(Abc_Ntk_t *pNtk,coloring *c,Vec_Int_t *randVec,Vec_Int_t **iDep,Vec_Int_t **oDep,
              Vec_Ptr_t **topOrder,Vec_Int_t **obs,Vec_Int_t **ctrl)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  int Entry;
  Vec_Ptr_t *pVVar4;
  int *pModel;
  int *__ptr;
  int *piVar5;
  Vec_Int_t *pVVar6;
  saucy_graph *psVar7;
  int *piVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  
  uVar2 = pNtk->vPos->nSize;
  uVar3 = pNtk->vPis->nSize;
  uVar14 = (ulong)uVar3;
  pModel = generateProperInputVector(pNtk,c,randVec);
  iVar10 = 0;
  if (pModel == (int *)0x0) {
    psVar7 = (saucy_graph *)0x0;
  }
  else {
    lVar13 = (long)(int)uVar2;
    __ptr = Abc_NtkVerifySimulatePattern(pNtk,pModel);
    if (0 < (int)uVar3) {
      uVar12 = 0;
      iVar10 = 0;
      do {
        if (c->clen[c->cfront[uVar12 + lVar13]] != 0) {
          pModel[uVar12] = (uint)(pModel[uVar12] == 0);
          piVar5 = Abc_NtkSimulateOneNode(pNtk,pModel,(int)uVar12,(Vec_Ptr_t **)oDep);
          pVVar6 = iDep[uVar12];
          if (0 < pVVar6->nSize) {
            lVar15 = 0;
            do {
              Entry = pVVar6->pArray[lVar15];
              if (__ptr[Entry] != piVar5[Entry]) {
                Vec_IntPush((Vec_Int_t *)topOrder[uVar12],Entry);
                if (iDep[uVar12]->nSize <= lVar15) goto LAB_002a6b8e;
                Vec_IntPush(obs[iDep[uVar12]->pArray[lVar15]],(int)uVar12);
                iVar10 = iVar10 + 1;
              }
              lVar15 = lVar15 + 1;
              pVVar6 = iDep[uVar12];
            } while (lVar15 < pVVar6->nSize);
          }
          pModel[uVar12] = (uint)(pModel[uVar12] == 0);
          if (piVar5 != (int *)0x0) {
            free(piVar5);
          }
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar14);
    }
    psVar7 = (saucy_graph *)malloc(0x18);
    piVar5 = (int *)malloc((long)(int)(uVar2 + uVar3) * 4 + 4);
    piVar8 = (int *)malloc((long)(iVar10 * 2) << 2);
    psVar7->n = uVar2 + uVar3;
    psVar7->e = iVar10;
    psVar7->adj = piVar5;
    psVar7->edg = piVar8;
    *piVar5 = 0;
    if (0 < (int)uVar2) {
      uVar12 = 0;
      do {
        lVar9 = (long)piVar5[uVar12];
        pVVar6 = obs[uVar12];
        iVar10 = pVVar6->nSize;
        lVar15 = iVar10 + lVar9;
        piVar5[uVar12 + 1] = (int)lVar15;
        if (0 < (long)iVar10) {
          lVar11 = 0;
          do {
            if (pVVar6->nSize <= lVar11) goto LAB_002a6b8e;
            piVar8[lVar9 + lVar11] = pVVar6->pArray[lVar11] + uVar2;
            lVar1 = lVar9 + lVar11;
            lVar11 = lVar11 + 1;
          } while (lVar1 + 1 < lVar15);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar2);
    }
    if (0 < (int)uVar3) {
      uVar12 = 0;
      do {
        lVar9 = (long)piVar5[lVar13 + uVar12];
        pVVar4 = topOrder[uVar12];
        iVar10 = pVVar4->nSize;
        lVar15 = iVar10 + lVar9;
        piVar5[lVar13 + uVar12 + 1] = (int)lVar15;
        if (0 < (long)iVar10) {
          lVar11 = 0;
          do {
            if (pVVar4->nSize <= lVar11) {
LAB_002a6b8e:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            piVar8[lVar9 + lVar11] = *(int *)((long)pVVar4->pArray + lVar11 * 4);
            lVar1 = lVar9 + lVar11;
            lVar11 = lVar11 + 1;
          } while (lVar1 + 1 < lVar15);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar14);
    }
    if (__ptr != (int *)0x0) {
      free(__ptr);
    }
    free(pModel);
    if (0 < (int)uVar3) {
      uVar12 = 0;
      do {
        topOrder[uVar12]->nSize = 0;
        uVar12 = uVar12 + 1;
      } while (uVar14 != uVar12);
    }
    if (0 < (int)uVar2) {
      lVar15 = 0;
      do {
        obs[lVar15]->nSize = 0;
        lVar15 = lVar15 + 1;
      } while (lVar13 != lVar15);
    }
  }
  return psVar7;
}

Assistant:

static struct saucy_graph *
buildSim2Graph( Abc_Ntk_t * pNtk, struct coloring *c, Vec_Int_t * randVec, Vec_Int_t ** iDep, Vec_Int_t ** oDep, Vec_Ptr_t ** topOrder, Vec_Int_t ** obs,  Vec_Int_t ** ctrl )
{
    int i, j, k;
    struct saucy_graph *g = NULL;
    int n, e = 0, *adj, *edg;
    int * vPiValues;
    int * output, * output2;
    int numouts =  Abc_NtkPoNum(pNtk);
    int numins =  Abc_NtkPiNum(pNtk);

    extern int * Abc_NtkSimulateOneNode( Abc_Ntk_t * , int * , int , Vec_Ptr_t ** );    
    
    vPiValues = generateProperInputVector(pNtk, c, randVec);
    if (vPiValues == NULL) 
        return NULL;

    output = Abc_NtkVerifySimulatePattern( pNtk, vPiValues );   
    
    for (i = 0; i < numins; i++) {
        if (!c->clen[c->cfront[i+numouts]]) continue;
        if (vPiValues[i] == 0)  vPiValues[i] = 1;
        else                    vPiValues[i] = 0;

        output2 = Abc_NtkSimulateOneNode( pNtk, vPiValues, i, topOrder );

        for (j = 0; j < Vec_IntSize(iDep[i]); j++) {
            if (output[Vec_IntEntry(iDep[i], j)] != output2[Vec_IntEntry(iDep[i], j)]) {
                Vec_IntPush(obs[i], Vec_IntEntry(iDep[i], j));
                Vec_IntPush(ctrl[Vec_IntEntry(iDep[i], j)], i);
                e++;
            }
        }

        if (vPiValues[i] == 0)  vPiValues[i] = 1;
        else                    vPiValues[i] = 0;

        ABC_FREE( output2 );
    }       

    /* build the graph */
    g = ABC_ALLOC(struct saucy_graph, 1);
    n = numouts + numins;
    adj = ints(n+1);
    edg = ints(2*e);        
    g->n = n;
    g->e = e;
    g->adj = adj;
    g->edg = edg;       

    adj[0] = 0;
    for (i = 0; i < numouts; i++) {
        adj[i+1] = adj[i] + Vec_IntSize(ctrl[i]);
        for (k = 0, j = adj[i]; j < adj[i+1]; j++, k++)
            edg[j] = Vec_IntEntry(ctrl[i], k) + numouts;
    }
    for (i = 0; i < numins; i++) {
        adj[i+numouts+1] = adj[i+numouts] + Vec_IntSize(obs[i]);
        for (k = 0, j = adj[i+numouts]; j < adj[i+numouts+1]; j++, k++)
            edg[j] = Vec_IntEntry(obs[i], k);
    }

    /* print graph */
    /*for (i = 0; i < n; i++) {
        printf("%d: ", i);
        for (j = adj[i]; j < adj[i+1]; j++)
            printf("%d ", edg[j]);
        printf("\n");
    }*/

    ABC_FREE( output );
    ABC_FREE( vPiValues );  
    for (j = 0; j < numins; j++)
        Vec_IntClear(obs[j]);
    for (j = 0; j < numouts; j++)
        Vec_IntClear(ctrl[j]);

    return g;
}